

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::BeginGlobal
          (BinaryReaderIR *this,Index index,Type type,bool mutable_)

{
  Location local_60;
  GlobalModuleField *local_40;
  _Head_base<0UL,_wabt::GlobalModuleField_*,_false> local_38;
  
  GetLocation(&local_60,this);
  MakeUnique<wabt::GlobalModuleField,wabt::Location>((wabt *)&local_40,&local_60);
  (local_40->global).type = type;
  (local_40->global).mutable_ = mutable_;
  local_38._M_head_impl = local_40;
  local_40 = (GlobalModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                       *)&local_38);
  if (local_38._M_head_impl != (GlobalModuleField *)0x0) {
    (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_38._M_head_impl = (GlobalModuleField *)0x0;
  if (local_40 != (GlobalModuleField *)0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginGlobal(Index index, Type type, bool mutable_) {
  auto field = MakeUnique<GlobalModuleField>(GetLocation());
  Global& global = field->global;
  global.type = type;
  global.mutable_ = mutable_;
  module_->AppendField(std::move(field));
  return Result::Ok;
}